

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall
discordpp::Channel::Channel
          (Channel *this,field<discordpp::Snowflake> *id,field<int> *type,
          omittable_field<discordpp::Snowflake> *guild_id,omittable_field<int> *position,
          omittable_field<std::vector<discordpp::Overwrite,_std::allocator<discordpp::Overwrite>_>_>
          *permission_overwrites,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *topic,omittable_field<bool> *nsfw,
          nullable_omittable_field<discordpp::Snowflake> *last_message_id,
          omittable_field<int> *bitrate,omittable_field<int> *user_limit,
          omittable_field<int> *rate_limit_per_user,
          omittable_field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>
          *recipients,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *icon,omittable_field<discordpp::Snowflake> *owner_id,
          omittable_field<discordpp::Snowflake> *application_id,omittable_field<bool> *managed,
          nullable_omittable_field<discordpp::Snowflake> *parent_id,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *last_pin_timestamp,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *rtc_region,omittable_field<int> *video_quality_mode,omittable_field<int> *message_count,
          omittable_field<int> *member_count,
          omittable_field<discordpp::ThreadMetadata> *thread_metadata,
          omittable_field<discordpp::ThreadMember> *member,
          omittable_field<int> *default_auto_archive_duration,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *permissions,omittable_field<int> *flags,omittable_field<int> *total_message_sent,
          omittable_field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>
          *available_tags,
          omittable_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
          *applied_tags,nullable_omittable_field<discordpp::DefaultReaction> *default_reaction_emoji
          ,omittable_field<int> *default_thread_rate_limit_per_user,
          nullable_omittable_field<int> *default_sort_order,
          omittable_field<int> *default_forum_layout)

{
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var4;
  _Head_base<0UL,_int_*,_false> _Var5;
  _Head_base<0UL,_bool_*,_false> _Var6;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  
  _Var1._M_head_impl =
       (id->t_)._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->id).t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
         (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)_Var4._M_head_impl;
  (this->id).s_ = id->s_;
  _Var2._M_head_impl =
       (type->t_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->type).s_ = type->s_;
  _Var1._M_head_impl =
       (guild_id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->guild_id).super_field<discordpp::Snowflake>.s_ =
       (guild_id->super_field<discordpp::Snowflake>).s_;
  (this->guild_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  _Var2._M_head_impl =
       (position->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->position).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->position).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->position).super_field<int>.s_ = (position->super_field<int>).s_;
  (this->position)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  field<std::vector<discordpp::Overwrite,_std::allocator<discordpp::Overwrite>_>_>::field
            (&(this->permission_overwrites).
              super_field<std::vector<discordpp::Overwrite,_std::allocator<discordpp::Overwrite>_>_>
             ,&permission_overwrites->
               super_field<std::vector<discordpp::Overwrite,_std::allocator<discordpp::Overwrite>_>_>
            );
  (this->permission_overwrites)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f308;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->name).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&name->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->name)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e1a8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->topic).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&topic->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->topic)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e1a8;
  _Var3._M_head_impl =
       (nsfw->super_field<bool>).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
       _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (bool *)0x0) {
    (this->nsfw).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
    _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
    super__Head_base<0UL,_bool_*,_false>._M_head_impl = (bool *)0x0;
    _Var6._M_head_impl = (bool *)0x0;
  }
  else {
    _Var6._M_head_impl = (bool *)operator_new(1);
    *_Var6._M_head_impl = *_Var3._M_head_impl;
  }
  (this->nsfw).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
  _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var6._M_head_impl;
  (this->nsfw).super_field<bool>.s_ = (nsfw->super_field<bool>).s_;
  (this->nsfw)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  _Var1._M_head_impl =
       (last_message_id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->last_message_id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->last_message_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->last_message_id).super_field<discordpp::Snowflake>.s_ =
       (last_message_id->super_field<discordpp::Snowflake>).s_;
  (this->last_message_id)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e440;
  _Var2._M_head_impl =
       (bitrate->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->bitrate).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->bitrate).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->bitrate).super_field<int>.s_ = (bitrate->super_field<int>).s_;
  (this->bitrate)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var2._M_head_impl =
       (user_limit->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->user_limit).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->user_limit).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->user_limit).super_field<int>.s_ = (user_limit->super_field<int>).s_;
  (this->user_limit)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var2._M_head_impl =
       (rate_limit_per_user->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->rate_limit_per_user).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->rate_limit_per_user).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->rate_limit_per_user).super_field<int>.s_ = (rate_limit_per_user->super_field<int>).s_;
  (this->rate_limit_per_user)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>::field
            (&(this->recipients).
              super_field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>,
             &recipients->
              super_field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>);
  (this->recipients)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f358;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->icon).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&icon->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->icon)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e1a8;
  _Var1._M_head_impl =
       (owner_id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->owner_id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->owner_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->owner_id).super_field<discordpp::Snowflake>.s_ =
       (owner_id->super_field<discordpp::Snowflake>).s_;
  (this->owner_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  _Var1._M_head_impl =
       (application_id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->application_id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->application_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->application_id).super_field<discordpp::Snowflake>.s_ =
       (application_id->super_field<discordpp::Snowflake>).s_;
  (this->application_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  _Var3._M_head_impl =
       (managed->super_field<bool>).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
       _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (bool *)0x0) {
    (this->managed).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var6._M_head_impl = (bool *)0x0;
  }
  else {
    _Var6._M_head_impl = (bool *)operator_new(1);
    *_Var6._M_head_impl = *_Var3._M_head_impl;
  }
  (this->managed).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
  _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var6._M_head_impl;
  (this->managed).super_field<bool>.s_ = (managed->super_field<bool>).s_;
  (this->managed)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  _Var1._M_head_impl =
       (parent_id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->parent_id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->parent_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->parent_id).super_field<discordpp::Snowflake>.s_ =
       (parent_id->super_field<discordpp::Snowflake>).s_;
  (this->parent_id)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e440;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->last_pin_timestamp).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&last_pin_timestamp->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->last_pin_timestamp)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e1a8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->rtc_region).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&rtc_region->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->rtc_region)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e1a8;
  _Var2._M_head_impl =
       (video_quality_mode->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->video_quality_mode).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->video_quality_mode).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->video_quality_mode).super_field<int>.s_ = (video_quality_mode->super_field<int>).s_;
  (this->video_quality_mode)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var2._M_head_impl =
       (message_count->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->message_count).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->message_count).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->message_count).super_field<int>.s_ = (message_count->super_field<int>).s_;
  (this->message_count)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var2._M_head_impl =
       (member_count->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->member_count).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->member_count).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->member_count).super_field<int>.s_ = (member_count->super_field<int>).s_;
  (this->member_count)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  field<discordpp::ThreadMetadata>::field
            (&(this->thread_metadata).super_field<discordpp::ThreadMetadata>,
             &thread_metadata->super_field<discordpp::ThreadMetadata>);
  (this->thread_metadata)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f3a8;
  field<discordpp::ThreadMember>::field
            (&(this->member).super_field<discordpp::ThreadMember>,
             &member->super_field<discordpp::ThreadMember>);
  (this->member)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f3f8;
  _Var2._M_head_impl =
       (default_auto_archive_duration->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->default_auto_archive_duration).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->default_auto_archive_duration).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->default_auto_archive_duration).super_field<int>.s_ =
       (default_auto_archive_duration->super_field<int>).s_;
  (this->default_auto_archive_duration)._vptr_omittable_field =
       (_func_int **)&PTR_operator__0024e298;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->permissions).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&permissions->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->permissions)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  _Var2._M_head_impl =
       (flags->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->flags).super_field<int>.s_ = (flags->super_field<int>).s_;
  (this->flags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  _Var2._M_head_impl =
       (total_message_sent->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->total_message_sent).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->total_message_sent).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->total_message_sent).super_field<int>.s_ = (total_message_sent->super_field<int>).s_;
  (this->total_message_sent)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>::field
            (&(this->available_tags).
              super_field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>,
             &available_tags->
              super_field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>);
  (this->available_tags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f448;
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&(this->applied_tags).
              super_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
             ,&applied_tags->
               super_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
            );
  (this->applied_tags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e570;
  field<discordpp::DefaultReaction>::field
            (&(this->default_reaction_emoji).super_field<discordpp::DefaultReaction>,
             &default_reaction_emoji->super_field<discordpp::DefaultReaction>);
  (this->default_reaction_emoji)._vptr_nullable_omittable_field =
       (_func_int **)&PTR_operator__0024f498;
  _Var2._M_head_impl =
       (default_thread_rate_limit_per_user->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->default_thread_rate_limit_per_user).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->default_thread_rate_limit_per_user).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->default_thread_rate_limit_per_user).super_field<int>.s_ =
       (default_thread_rate_limit_per_user->super_field<int>).s_;
  (this->default_thread_rate_limit_per_user)._vptr_omittable_field =
       (_func_int **)&PTR_operator__0024e298;
  _Var2._M_head_impl =
       (default_sort_order->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->default_sort_order).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->default_sort_order).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->default_sort_order).super_field<int>.s_ = (default_sort_order->super_field<int>).s_;
  (this->default_sort_order)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024e1f8;
  _Var2._M_head_impl =
       (default_forum_layout->super_field<int>).t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    (this->default_forum_layout).super_field<int>.t_._M_t.
    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->default_forum_layout).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->default_forum_layout).super_field<int>.s_ = (default_forum_layout->super_field<int>).s_;
  (this->default_forum_layout)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  return;
}

Assistant:

Channel(
        field<Snowflake> id = uninitialized,
        field<int> type = uninitialized,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<int> position = omitted,
        omittable_field<std::vector<Overwrite> > permission_overwrites = omitted,
        nullable_omittable_field<std::string> name = omitted,
        nullable_omittable_field<std::string> topic = omitted,
        omittable_field<bool> nsfw = omitted,
        nullable_omittable_field<Snowflake> last_message_id = omitted,
        omittable_field<int> bitrate = omitted,
        omittable_field<int> user_limit = omitted,
        omittable_field<int> rate_limit_per_user = omitted,
        omittable_field<std::vector<User> > recipients = omitted,
        nullable_omittable_field<std::string> icon = omitted,
        omittable_field<Snowflake> owner_id = omitted,
        omittable_field<Snowflake> application_id = omitted,
        omittable_field<bool> managed = omitted,
        nullable_omittable_field<Snowflake> parent_id = omitted,
        nullable_omittable_field<Timestamp> last_pin_timestamp = omitted,
        nullable_omittable_field<std::string> rtc_region = omitted,
        omittable_field<int> video_quality_mode = omitted,
        omittable_field<int> message_count = omitted,
        omittable_field<int> member_count = omitted,
        omittable_field<ThreadMetadata> thread_metadata = omitted,
        omittable_field<ThreadMember> member = omitted,
        omittable_field<int> default_auto_archive_duration = omitted,
        omittable_field<std::string> permissions = omitted,
        omittable_field<int> flags = omitted,
        omittable_field<int> total_message_sent = omitted,
        omittable_field<std::vector<ForumTag> > available_tags = omitted,
        omittable_field<std::vector<Snowflake> > applied_tags = omitted,
        nullable_omittable_field<DefaultReaction> default_reaction_emoji = omitted,
        omittable_field<int> default_thread_rate_limit_per_user = omitted,
        nullable_omittable_field<int> default_sort_order = omitted,
        omittable_field<int> default_forum_layout = omitted
    ):
        id(id),
        type(type),
        guild_id(guild_id),
        position(position),
        permission_overwrites(permission_overwrites),
        name(name),
        topic(topic),
        nsfw(nsfw),
        last_message_id(last_message_id),
        bitrate(bitrate),
        user_limit(user_limit),
        rate_limit_per_user(rate_limit_per_user),
        recipients(recipients),
        icon(icon),
        owner_id(owner_id),
        application_id(application_id),
        managed(managed),
        parent_id(parent_id),
        last_pin_timestamp(last_pin_timestamp),
        rtc_region(rtc_region),
        video_quality_mode(video_quality_mode),
        message_count(message_count),
        member_count(member_count),
        thread_metadata(thread_metadata),
        member(member),
        default_auto_archive_duration(default_auto_archive_duration),
        permissions(permissions),
        flags(flags),
        total_message_sent(total_message_sent),
        available_tags(available_tags),
        applied_tags(applied_tags),
        default_reaction_emoji(default_reaction_emoji),
        default_thread_rate_limit_per_user(default_thread_rate_limit_per_user),
        default_sort_order(default_sort_order),
        default_forum_layout(default_forum_layout)
    {}